

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O2

SourceLocation * __thiscall
flow::lang::ParamList::location(SourceLocation *__return_storage_ptr__,ParamList *this)

{
  FilePos *pFVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  Expr *pEVar6;
  Expr *pEVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  puVar4 = (this->values_).
           super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->values_).
           super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 == puVar5) {
    SourceLocation::SourceLocation(__return_storage_ptr__);
  }
  else {
    pEVar6 = (puVar4->_M_t).
             super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
             super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
    pFVar1 = (FilePos *)((long)&(pEVar6->super_ASTNode).location_ + 0x20);
    uVar8 = pFVar1->line;
    uVar9 = pFVar1->column;
    uVar2 = *(uint *)((long)&(pEVar6->super_ASTNode).location_ + 0x28);
    pEVar7 = puVar5[-1]._M_t.
             super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
             super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
    pFVar1 = (FilePos *)((long)&(pEVar7->super_ASTNode).location_ + 0x2c);
    uVar10 = pFVar1->line;
    uVar11 = pFVar1->column;
    uVar3 = *(uint *)((long)&(pEVar7->super_ASTNode).location_ + 0x34);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(pEVar6->super_ASTNode).location_);
    (__return_storage_ptr__->begin).line = uVar8;
    (__return_storage_ptr__->begin).column = uVar9;
    (__return_storage_ptr__->begin).offset = uVar2;
    (__return_storage_ptr__->end).line = uVar10;
    (__return_storage_ptr__->end).column = uVar11;
    (__return_storage_ptr__->end).offset = uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

SourceLocation ParamList::location() const {
  if (values_.empty()) return SourceLocation();

  return SourceLocation(front()->location().filename, front()->location().begin,
                      back()->location().end);
}